

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void codearith(FuncState *fs,OpCode op,expdesc *e1,expdesc *e2)

{
  double __x;
  double __y;
  expdesc *e;
  int iVar1;
  int b;
  expdesc *e_00;
  lua_Number lVar2;
  double dVar3;
  
  iVar1 = isnumeral(e1);
  if ((iVar1 == 0) || (iVar1 = isnumeral(e2), iVar1 == 0)) {
LAB_0010c3ad:
    iVar1 = 0;
    if ((op != OP_UNM) && (iVar1 = 0, op != OP_LEN)) {
LAB_0010c3bb:
      iVar1 = luaK_exp2RK(fs,e2);
    }
LAB_0010c3c8:
    b = luaK_exp2RK(fs,e1);
    e_00 = e2;
    e = e1;
    if (b <= iVar1) {
      e_00 = e1;
      e = e2;
    }
    freeexp(fs,e);
    freeexp(fs,e_00);
    iVar1 = luaK_codeABC(fs,op,0,b,iVar1);
    (e1->u).s.info = iVar1;
    e1->k = VRELOCABLE;
  }
  else {
    lVar2 = 0.0;
    if (op - OP_ADD < 9) {
      __x = (e1->u).nval;
      __y = (e2->u).nval;
      switch(op) {
      case OP_ADD:
        lVar2 = __x + __y;
        break;
      case OP_SUB:
        lVar2 = __x - __y;
        break;
      case OP_MUL:
        lVar2 = __x * __y;
        break;
      case OP_DIV:
        if ((__y != 0.0) || (NAN(__y))) {
          lVar2 = __x / __y;
          break;
        }
        goto LAB_0010c3bb;
      case OP_MOD:
        if ((__y == 0.0) && (!NAN(__y))) goto LAB_0010c3bb;
        dVar3 = floor(__x / __y);
        lVar2 = __x - dVar3 * __y;
        break;
      case OP_POW:
        lVar2 = pow(__x,__y);
        break;
      case OP_UNM:
        lVar2 = -__x;
        break;
      case OP_NOT:
        goto switchD_0010c363_caseD_13;
      case OP_LEN:
        iVar1 = 0;
        goto LAB_0010c3c8;
      }
      if (NAN(lVar2)) goto LAB_0010c3ad;
    }
switchD_0010c363_caseD_13:
    (e1->u).nval = lVar2;
  }
  return;
}

Assistant:

static void codearith(FuncState*fs,OpCode op,expdesc*e1,expdesc*e2){
if(constfolding(op,e1,e2))
return;
else{
int o2=(op!=OP_UNM&&op!=OP_LEN)?luaK_exp2RK(fs,e2):0;
int o1=luaK_exp2RK(fs,e1);
if(o1>o2){
freeexp(fs,e1);
freeexp(fs,e2);
}
else{
freeexp(fs,e2);
freeexp(fs,e1);
}
e1->u.s.info=luaK_codeABC(fs,op,0,o1,o2);
e1->k=VRELOCABLE;
}
}